

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O1

JL_STATUS OutputStringObject(JlDataObject *StringObject,JlBuffer *JsonBuffer,
                            JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  char *pcVar1;
  JL_STATUS JVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *Utf8String;
  char *pcVar6;
  uint32_t unicodeValue;
  char string_1 [7];
  char *string;
  size_t numBytes;
  uint32_t local_54;
  char local_50 [16];
  char *local_40;
  size_t local_38;
  
  local_40 = (char *)0x0;
  pcVar6 = "\\\'";
  if ((OutputFlags & 8) == 0) {
    pcVar6 = "\\\"";
  }
  pcVar6 = pcVar6 + 1;
  JVar2 = JlGetObjectString(StringObject,&local_40);
  if (JVar2 == JL_STATUS_SUCCESS) {
    if (local_40 == (char *)0x0) {
      pcVar6 = "null";
      sVar4 = 4;
    }
    else {
      JVar2 = JlBufferAdd(JsonBuffer,pcVar6,1);
      pcVar1 = local_40;
      if (JVar2 == JL_STATUS_SUCCESS) {
        sVar3 = strlen(local_40);
        if (sVar3 == 0) {
          JVar2 = JL_STATUS_SUCCESS;
        }
        else {
          uVar5 = 0;
          do {
            local_54 = 0;
            Utf8String = pcVar1 + uVar5;
            JVar2 = JlUnicodeCharFromUtf8(Utf8String,sVar3 - uVar5,&local_54,&local_38);
            if (JVar2 == JL_STATUS_SUCCESS) {
              sVar4 = local_38;
              if (((0x5f < local_54 - 0x20) ||
                  ((local_54 - 0x22 < 0x3b &&
                   ((0x400000000000021U >> ((ulong)(local_54 - 0x22) & 0x3f) & 1) != 0)))) &&
                 (local_54 < 0x80 || (OutputFlags & 1) != 0)) {
                if ((int)local_54 < 0x22) {
                  switch(local_54) {
                  case 8:
                    Utf8String = "\\b";
                    sVar4 = 2;
                    break;
                  case 9:
                    Utf8String = "\\t";
                    sVar4 = 2;
                    break;
                  case 10:
                    Utf8String = "\\n";
                    sVar4 = 2;
                    break;
                  default:
switchD_00102734_caseD_b:
                    if (local_54 < 0xffff) {
                      local_50[4] = 0;
                      local_50[5] = '\0';
                      local_50[6] = '\0';
                      local_50[0] = '\0';
                      local_50[1] = '\0';
                      local_50[2] = '\0';
                      local_50[3] = '\0';
                      Utf8String = local_50;
                      sprintf(Utf8String,"\\u%4.4x",(ulong)local_54);
                      sVar4 = 6;
                    }
                    else {
                      local_50[8] = '\0';
                      local_50[9] = '\0';
                      local_50[10] = '\0';
                      local_50[0xb] = '\0';
                      local_50[0xc] = '\0';
                      local_50[0] = '\0';
                      local_50[1] = '\0';
                      local_50[2] = '\0';
                      local_50[3] = '\0';
                      local_50[4] = 0;
                      local_50[5] = '\0';
                      local_50[6] = '\0';
                      local_50[7] = 0;
                      Utf8String = local_50;
                      sprintf(Utf8String,"\\u%4.4x\\u%4.4x",(ulong)(local_54 - 0x10000 >> 10),
                              (ulong)(local_54 & 0x3ff));
                      sVar4 = 0xc;
                    }
                    break;
                  case 0xc:
                    Utf8String = "\\f";
                    sVar4 = 2;
                    break;
                  case 0xd:
                    Utf8String = "\\r";
                    sVar4 = 2;
                  }
                }
                else if (local_54 == 0x5c) {
                  Utf8String = "\\\\";
                  sVar4 = 2;
                }
                else if (local_54 == 0x27) {
                  if ((OutputFlags & 8) == 0) {
                    Utf8String = "\'";
                    sVar4 = 1;
                  }
                  else {
                    Utf8String = "\\\'";
                    sVar4 = 2;
                  }
                }
                else {
                  if (local_54 != 0x22) goto switchD_00102734_caseD_b;
                  Utf8String = "\\\"";
                  sVar4 = 2;
                }
              }
              JVar2 = JlBufferAdd(JsonBuffer,Utf8String,sVar4);
            }
            uVar5 = uVar5 + local_38;
          } while ((uVar5 < sVar3) && (JVar2 == JL_STATUS_SUCCESS));
        }
      }
      if (JVar2 != JL_STATUS_SUCCESS) {
        return JVar2;
      }
      sVar4 = 1;
    }
    JVar2 = JlBufferAdd(JsonBuffer,pcVar6,sVar4);
  }
  return JVar2;
}

Assistant:

JL_STATUS
    OutputStringObject
    (
        JlDataObject const*     StringObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    char const* string = NULL;
    char const* const quoteCharStr = OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES ? "\'" : "\"";
    bool escapeSingleQuote = (OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES) ? true : false;
    bool escapeNonAscii = (OutputFlags & JL_OUTPUT_FLAGS_ASCII) ? true : false;

    jlStatus = JlGetObjectString( StringObject, &string );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( NULL != string )
        {
            jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = OutputUtf8String( string, escapeNonAscii, escapeSingleQuote, JsonBuffer );
            }
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
            }
        }
        else
        {
            jlStatus = JlBufferAdd( JsonBuffer, "null", 4 );
        }
    }

    return jlStatus;
}